

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void Mem_StepEntryRecycle(Mem_Step_t *p,char *pEntry,int nBytes)

{
  Mem_Fixed_t *pMVar1;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    pMVar1 = p->pMap[nBytes];
    pMVar1->nEntriesUsed = pMVar1->nEntriesUsed + -1;
    *(char **)pEntry = pMVar1->pEntriesFree;
    pMVar1->pEntriesFree = pEntry;
  }
  return;
}

Assistant:

void Mem_StepEntryRecycle( Mem_Step_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Mem_FixedEntryRecycle( p->pMap[nBytes], pEntry );
}